

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void anon_unknown.dwarf_1ac78::iDrawLine(Vec3 *startPoint,Vec3 *endPoint,Color *color)

{
  PFNGLCOLOR3FPROC p_Var1;
  int in_EAX;
  int in_ECX;
  void *extraout_RDX;
  Vec3 *pVVar2;
  char *in_R8;
  int in_R9D;
  GLfloat extraout_XMM0_Da;
  float fVar3;
  float fVar4;
  
  pVVar2 = endPoint;
  OpenSteer::warnIfInUpdatePhase("iDrawLine");
  p_Var1 = glad_glColor3f;
  OpenSteer::Color::r(color,pVVar2,extraout_RDX,in_ECX,in_R8,in_R9D,in_EAX);
  fVar3 = OpenSteer::Color::g(color);
  fVar4 = OpenSteer::Color::b(color);
  (*p_Var1)(extraout_XMM0_Da,fVar3,fVar4);
  (*glad_glBegin)(1);
  iglVertexVec3(startPoint);
  iglVertexVec3(endPoint);
  (*glad_glEnd)();
  return;
}

Assistant:

inline void iDrawLine (const OpenSteer::Vec3& startPoint,
                           const OpenSteer::Vec3& endPoint,
                           const OpenSteer::Color& color)
    {
        OpenSteer::warnIfInUpdatePhase ("iDrawLine");
        glColor3f (color.r(), color.g(), color.b());
        glBegin (GL_LINES);
        glVertexVec3 (startPoint);
        glVertexVec3 (endPoint);
        glEnd ();
    }